

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall BCLog::Logger::ShrinkDebugFile(Logger *this)

{
  string_view source_file;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  void *__s;
  Logger *pLVar4;
  size_t sVar5;
  path *__filename;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  string local_78;
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_file_path).super_path._M_pathname._M_string_length == 0) {
    __assert_fail("!m_file_path.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                  ,0x1d9,"void BCLog::Logger::ShrinkDebugFile()");
  }
  __filename = &this->m_file_path;
  __stream = fsbridge::fopen((char *)__filename,"r");
  uVar3 = std::filesystem::file_size(&__filename->super_path);
  if ((__stream == (FILE *)0x0) || (uVar3 < 0xa7d8c1)) {
    if (__stream != (FILE *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        fclose(__stream);
        return;
      }
      goto LAB_0016e52f;
    }
  }
  else {
    __s = operator_new(10000000);
    memset(__s,0,10000000);
    iVar2 = fseek(__stream,-10000000,2);
    if (iVar2 == 0) {
      sVar5 = fread(__s,1,10000000,__stream);
      fclose(__stream);
      __stream = fsbridge::fopen((char *)__filename,"w");
      if (__stream != (FILE *)0x0) {
        fwrite(__s,1,(long)(int)sVar5,__stream);
        goto LAB_0016e254;
      }
    }
    else {
      pLVar4 = LogInstance();
      bVar1 = Enabled(pLVar4);
      if (bVar1) {
        local_50 = 0;
        local_48 = '\0';
        local_58 = &local_48;
        tinyformat::format<>(&local_78,"Failed to shrink debug log file: fseek(...) failed\n");
        ShrinkDebugFile();
        pLVar4 = LogInstance();
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp";
        source_file._M_len = 0x54;
        str._M_str = local_58;
        str._M_len = local_50;
        logging_function._M_str = "ShrinkDebugFile";
        logging_function._M_len = 0xf;
        LogPrintStr(pLVar4,str,logging_function,source_file,0x1eb,ALL,Info);
        if (local_58 != &local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
      }
LAB_0016e254:
      fclose(__stream);
    }
    operator_delete(__s,10000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0016e52f:
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::ShrinkDebugFile()
{
    // Amount of debug.log to save at end when shrinking (must fit in memory)
    constexpr size_t RECENT_DEBUG_HISTORY_SIZE = 10 * 1000000;

    assert(!m_file_path.empty());

    // Scroll debug.log if it's getting too big
    FILE* file = fsbridge::fopen(m_file_path, "r");

    // Special files (e.g. device nodes) may not have a size.
    size_t log_size = 0;
    try {
        log_size = fs::file_size(m_file_path);
    } catch (const fs::filesystem_error&) {}

    // If debug.log file is more than 10% bigger the RECENT_DEBUG_HISTORY_SIZE
    // trim it down by saving only the last RECENT_DEBUG_HISTORY_SIZE bytes
    if (file && log_size > 11 * (RECENT_DEBUG_HISTORY_SIZE / 10))
    {
        // Restart the file with some of the end
        std::vector<char> vch(RECENT_DEBUG_HISTORY_SIZE, 0);
        if (fseek(file, -((long)vch.size()), SEEK_END)) {
            LogPrintf("Failed to shrink debug log file: fseek(...) failed\n");
            fclose(file);
            return;
        }
        int nBytes = fread(vch.data(), 1, vch.size(), file);
        fclose(file);

        file = fsbridge::fopen(m_file_path, "w");
        if (file)
        {
            fwrite(vch.data(), 1, nBytes, file);
            fclose(file);
        }
    }
    else if (file != nullptr)
        fclose(file);
}